

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O2

bool __thiscall
ReplayInterface::enqueue_create_sampler
          (ReplayInterface *this,Hash hash,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  bool bVar1;
  bool bVar2;
  Hash in_RAX;
  Hash recorded_hash;
  Hash local_28;
  
  local_28 = in_RAX;
  bVar1 = Fossilize::Hashing::compute_hash_sampler(create_info,&local_28);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_28 == hash)) {
    *sampler = (VkSampler)hash;
    bVar2 = Fossilize::StateRecorder::record_sampler(&this->recorder,(VkSampler)hash,create_info,0);
  }
  return bVar2;
}

Assistant:

bool enqueue_create_sampler(Hash hash, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_sampler(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*sampler = fake_handle<VkSampler>(hash);
		return recorder.record_sampler(*sampler, *create_info);
	}